

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O3

void __thiscall CDT::CDT(CDT *this,DataSet *dataset,uint n_input,bool dc_sort)

{
  (this->m_dataset).m_filepath._M_dataplus._M_p = (pointer)&(this->m_dataset).m_filepath.field_2;
  (this->m_dataset).m_filepath._M_string_length = 0;
  (this->m_dataset).m_filepath.field_2._M_local_buf[0] = '\0';
  (this->m_dataset).m_matrix.m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dataset).m_matrix.m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dataset).m_matrix.m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dataset).m_labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dataset).m_labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dataset).m_labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_dataset).m_matrix.m_shape.n_row = 0;
  (this->m_dataset).m_matrix.m_shape.n_col = 0;
  (this->m_dataset).m_matrix.m_shape.is_diogonal = false;
  (this->m_input).m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_input).m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_input).m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_output).m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_output).m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_output).m_elems.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_output).m_shape.n_row = 0;
  (this->m_output).m_shape.n_col = 0;
  (this->m_output).m_shape.is_diogonal = false;
  (this->m_function).m_params.super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_function).m_params.super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_function).m_params.super__Vector_base<Func_Param,_std::allocator<Func_Param>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->m_input).m_shape.n_row = 0;
  (this->m_input).m_shape.n_col = 0;
  (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_input).m_shape.is_diogonal = false;
  (this->m_cdt_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cdt_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_info).keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cdt_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_info).keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_info).keys.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  set(this,dataset,n_input,dc_sort);
  (this->m_function).m_optimization.fit_func = NO_FIT;
  (this->m_function).m_optimization.split_dist = HALF;
  (this->m_function).m_optimization.confidence = 5;
  return;
}

Assistant:

CDT::CDT(const DataSet& dataset, unsigned n_input, bool dc_sort){
    set(dataset, n_input, dc_sort);
    m_function.m_optimization=Optimization{NO_FIT, HALF, 5};
}